

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateArray(ExpressionTranslateContext *ctx,ExprArray *expression)

{
  ExprBase *local_28;
  ExprBase *curr;
  uint index;
  ExprArray *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  TranslateTypeName(ctx,(expression->super_ExprBase).type);
  Print(ctx,"()");
  curr._4_4_ = 0;
  for (local_28 = (expression->values).head; local_28 != (ExprBase *)0x0; local_28 = local_28->next)
  {
    Print(ctx,".set(%d, ",(ulong)curr._4_4_);
    Translate(ctx,local_28);
    Print(ctx,")");
    curr._4_4_ = curr._4_4_ + 1;
  }
  return;
}

Assistant:

void TranslateArray(ExpressionTranslateContext &ctx, ExprArray *expression)
{
	TranslateTypeName(ctx, expression->type);
	Print(ctx, "()");

	unsigned index = 0;

	for(ExprBase *curr = expression->values.head; curr; curr = curr->next)
	{
		Print(ctx, ".set(%d, ", index);
		Translate(ctx, curr);
		Print(ctx, ")");

		index++;
	}
}